

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int removefrom_hashtable(hash_table_t *table,hash_key_t key)

{
  int iVar1;
  hash_entry_t *phStack_28;
  int result;
  hash_entry_t *entry;
  hash_key_t key_local;
  hash_table_t *table_local;
  
  phStack_28 = (hash_entry_t *)0x0;
  entry = (hash_entry_t *)key;
  key_local = table;
  iVar1 = lookup(table,key,&stack0xffffffffffffffd8);
  if (iVar1 == -1) {
    table_local._4_4_ = -1;
  }
  else {
    phStack_28->key = (hash_key_t)0x0;
    phStack_28->data = (hash_data_t)0x0;
    phStack_28->hash_value = 0;
    phStack_28->status = 1;
    if (phStack_28->next != (hash_entry_t *)0x0) {
      phStack_28->next->prev = phStack_28->prev;
    }
    if (phStack_28->prev != (hash_entry_t *)0x0) {
      phStack_28->prev->next = phStack_28->next;
    }
    if (*(hash_entry_t **)((long)key_local + 0x28) == phStack_28) {
      *(hash_entry_t **)((long)key_local + 0x28) = phStack_28->next;
    }
    *(long *)((long)key_local + 8) = *(long *)((long)key_local + 8) + -1;
    table_local._4_4_ = 0;
  }
  return table_local._4_4_;
}

Assistant:

int removefrom_hashtable(hash_table_t *table, hash_key_t key) {
  hash_entry_t *entry = NULL;
  int result = 0;

  result = lookup(table, key, &entry);
  if (result == -1) return -1;

  entry->key = NULL;
  entry->data = NULL;
  entry->hash_value = 0;
  entry->status = TOMBSTONE;
  if (entry->next) entry->next->prev = entry->prev;
  if (entry->prev) entry->prev->next = entry->next;
  if (table->head == entry) table->head = entry->next;
  // Do not set entry->next to NULL, which would break the iterate & delete
  // idiom used under dlopen_wrapper.

  table->entry_count--;
  return 0;
}